

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_spectrum.cpp
# Opt level: O3

Spectrum *
window_standards::create_spectrum
          (Spectrum *__return_storage_ptr__,string *line,string *standard_directory)

{
  string *this;
  int iVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  pointer pcVar3;
  pointer ppVar4;
  pointer ppVar5;
  bool bVar6;
  size_type sVar7;
  pointer psVar8;
  int *piVar9;
  undefined8 uVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  size_type __len2;
  Spectrum_Type SVar14;
  double dVar15;
  string spectum_path;
  string a;
  string b;
  regex pattern;
  undefined1 local_108 [40];
  char *local_e0;
  undefined8 local_d8;
  char local_d0;
  undefined7 uStack_cf;
  char *local_c0;
  undefined8 local_b8;
  char local_b0;
  undefined7 uStack_af;
  double *local_a0;
  string *local_98;
  char *local_90;
  Spectrum local_88;
  
  this = &__return_storage_ptr__->description;
  (__return_storage_ptr__->description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->description).field_2;
  SVar14 = NONE;
  (__return_storage_ptr__->description)._M_string_length = 0;
  (__return_storage_ptr__->description).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->t = NAN;
  __return_storage_ptr__->a = NAN;
  __return_storage_ptr__->b = NAN;
  (__return_storage_ptr__->values).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar12 = "TestCreateSpectrum_None";
  __len2 = 4;
  local_98 = standard_directory;
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"None",0,4);
  if (sVar7 != 0xffffffffffffffff) {
LAB_00131562:
    __return_storage_ptr__->type = SVar14;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this,0,(__return_storage_ptr__->description)._M_string_length,pcVar12 + 0x13,__len2);
    return __return_storage_ptr__;
  }
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"Blackbody",0,9);
  if ((sVar7 == 0xffffffffffffffff) ||
     (sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (line,".SSP",0,4), sVar7 != 0xffffffffffffffff)) {
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (line,"UV Action",0,9);
    if ((sVar7 == 0xffffffffffffffff) ||
       (sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(line,".SSP",0,4), sVar7 != 0xffffffffffffffff)) {
      pcVar12 = "TestCreateSpectrum_Krochmann";
      __len2 = 9;
      local_a0 = &__return_storage_ptr__->t;
      sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (line,"Krochmann",0,9);
      if (sVar7 != 0xffffffffffffffff) {
        sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(line,".SSP",0,4);
        SVar14 = KROCHMANN;
        if (sVar7 == 0xffffffffffffffff) goto LAB_00131562;
      }
      pcVar3 = (local_98->_M_dataplus)._M_p;
      local_108._0_8_ = (pointer)(local_108 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,pcVar3,pcVar3 + local_98->_M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (line->_M_dataplus)._M_p,line->_M_string_length);
      load_spectrum(&local_88,(string *)local_108);
      __return_storage_ptr__->type = local_88.type;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this,&local_88.description);
      *local_a0 = local_88.t;
      local_a0[1] = local_88.a;
      local_a0[2] = local_88.b;
      ppVar4 = (__return_storage_ptr__->values).
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (__return_storage_ptr__->values).
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->values).
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_88.values.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_88.values.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.values.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.values.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.values.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.values.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((ppVar4 != (pointer)0x0) &&
         (operator_delete(ppVar4,(long)ppVar5 - (long)ppVar4),
         local_88.values.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_88.values.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.values.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.values.
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.description._M_dataplus._M_p != &local_88.description.field_2) {
        operator_delete(local_88.description._M_dataplus._M_p,
                        local_88.description.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_108._0_8_ == (pointer)(local_108 + 0x10)) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->type = UV_ACTION;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this,0,(__return_storage_ptr__->description)._M_string_length,"UV Action",9);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88,
               ".*a=(.*), b=(.*)\\)",0x10);
    local_108._16_8_ = (pointer)0x0;
    local_108._24_8_ = (char *)0x0;
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = (pointer)0x0;
    _Var2._M_current = (line->_M_dataplus)._M_p;
    bVar6 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(_Var2._M_current + line->_M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_108,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88,0);
    if (!bVar6) goto LAB_001319ff;
    lVar11 = local_108._8_8_ - local_108._0_8_;
    if ((lVar11 == 0) || (0xfffffffffffffffd < (lVar11 >> 3) * -0x5555555555555555 - 5U)) {
      psVar8 = (pointer)(local_108._0_8_ + lVar11 + -0x48);
    }
    else {
      psVar8 = (pointer)(local_108._0_8_ + 0x18);
    }
    if (psVar8->matched == true) {
      local_e0 = &local_d0;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_e0,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
      lVar11 = local_108._8_8_ - local_108._0_8_;
    }
    else {
      local_e0 = &local_d0;
      local_d8 = 0;
      local_d0 = '\0';
    }
    if ((local_108._0_8_ == local_108._8_8_) ||
       (0xfffffffffffffffc < (lVar11 >> 3) * -0x5555555555555555 - 6U)) {
      psVar8 = (pointer)(local_108._0_8_ + lVar11 + -0x48);
    }
    else {
      psVar8 = (pointer)(local_108._0_8_ + 0x30);
    }
    local_c0 = &local_b0;
    if (psVar8->matched == true) {
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_c0,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_b8 = 0;
      local_b0 = '\0';
    }
    pcVar12 = local_e0;
    piVar9 = __errno_location();
    iVar1 = *piVar9;
    *piVar9 = 0;
    dVar15 = strtod(pcVar12,&local_90);
    if (local_90 == pcVar12) goto LAB_00131a33;
    iVar13 = *piVar9;
    if (iVar13 == 0) {
LAB_00131977:
      *piVar9 = iVar1;
      iVar13 = iVar1;
    }
    else if (iVar13 == 0x22) {
      dVar15 = (double)std::__throw_out_of_range("stod");
      goto LAB_00131977;
    }
    pcVar12 = local_c0;
    __return_storage_ptr__->a = dVar15;
    *piVar9 = 0;
    dVar15 = strtod(local_c0,&local_90);
    if (local_90 == pcVar12) {
LAB_00131a3f:
      uVar10 = std::__throw_invalid_argument("stod");
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
      }
      if ((pointer)local_108._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88);
      Spectrum::~Spectrum(__return_storage_ptr__);
      _Unwind_Resume(uVar10);
    }
    pcVar12 = &local_b0;
    if (*piVar9 == 0) {
LAB_001319c5:
      *piVar9 = iVar13;
    }
    else if (*piVar9 == 0x22) {
      dVar15 = (double)std::__throw_out_of_range("stod");
      goto LAB_001319c5;
    }
    __return_storage_ptr__->b = dVar15;
    if (local_c0 != pcVar12) {
      operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
    }
  }
  else {
    __return_storage_ptr__->type = BLACKBODY;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (this,0,(__return_storage_ptr__->description)._M_string_length,"Blackbody",9);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88,".*T=(.*)K\\)",0x10
              );
    local_108._16_8_ = (pointer)0x0;
    local_108._24_8_ = (char *)0x0;
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = (pointer)0x0;
    _Var2._M_current = (line->_M_dataplus)._M_p;
    bVar6 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(_Var2._M_current + line->_M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_108,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88,0);
    if (!bVar6) goto LAB_001319ff;
    lVar11 = local_108._8_8_ - local_108._0_8_;
    if ((lVar11 == 0) || (0xfffffffffffffffd < (lVar11 >> 3) * -0x5555555555555555 - 5U)) {
      psVar8 = (pointer)(local_108._0_8_ + lVar11 + -0x48);
    }
    else {
      psVar8 = (pointer)(local_108._0_8_ + 0x18);
    }
    if (psVar8->matched == true) {
      local_e0 = &local_d0;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_e0,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_e0 = &local_d0;
      local_d8 = 0;
      local_d0 = '\0';
    }
    pcVar12 = local_e0;
    piVar9 = __errno_location();
    iVar1 = *piVar9;
    *piVar9 = 0;
    dVar15 = strtod(pcVar12,&local_c0);
    if (local_c0 == pcVar12) {
      std::__throw_invalid_argument("stod");
LAB_00131a33:
      std::__throw_invalid_argument("stod");
      goto LAB_00131a3f;
    }
    if (*piVar9 == 0) {
LAB_001318a8:
      *piVar9 = iVar1;
    }
    else if (*piVar9 == 0x22) {
      dVar15 = (double)std::__throw_out_of_range("stod");
      goto LAB_001318a8;
    }
    __return_storage_ptr__->t = dVar15;
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
LAB_001319ff:
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

Spectrum create_spectrum(std::string const & line, std::string const & standard_directory)
    {
        Spectrum spectrum;

        if(line.find("None") != std::string::npos)
        {
            spectrum.type = Spectrum_Type::NONE;
            spectrum.description = "None";
        }
        else if(line.find("Blackbody") != std::string::npos && line.find(".SSP") == std::string::npos)
        {
            spectrum.type = Spectrum_Type::BLACKBODY;
            spectrum.description = "Blackbody";

            std::regex pattern(".*T=(.*)K\\)");
            // auto itr = std::sregex_iterator(line.begin(), line.end(), pattern);
            // std::string val = itr->str();
            std::smatch matches;
            if(std::regex_search(line, matches, pattern))
            {
                std::string val = matches[1].str();
                spectrum.t = std::stod(val);
            }
        }
        else if(line.find("UV Action") != std::string::npos && line.find(".SSP") == std::string::npos)
        {
            spectrum.type = Spectrum_Type::UV_ACTION;
            spectrum.description = "UV Action";
            std::regex pattern(".*a=(.*), b=(.*)\\)");
            // auto itr = std::sregex_iterator(line.begin(), line.end(), pattern);
            // std::string a = itr->str(1);
            // std::string a = itr->str(2);
            std::smatch matches;
            if(std::regex_search(line, matches, pattern))
            {
                std::string a = matches[1].str();
                std::string b = matches[2].str();
                spectrum.a = std::stod(a);
                spectrum.b = std::stod(b);
            }
        }
        else if((line.find("Krochmann") != std::string::npos) && (line.find(".SSP") == std::string::npos))
        {
            spectrum.type = Spectrum_Type::KROCHMANN;
            spectrum.description = "Krochmann";
        }
        else
        {
            std::string spectum_path = standard_directory;
            spectum_path += line;
            spectrum = load_spectrum(spectum_path);
        }

        return spectrum;
    }